

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI.cpp
# Opt level: O1

string * __thiscall A2::dump_abi_cxx11_(string *__return_storage_ptr__,A2 *this)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  long lVar3;
  string *psVar4;
  int iVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  ulong *puVar9;
  size_type *psVar10;
  Type in_EDX;
  pointer __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string tags;
  string atts;
  string output;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  string *local_60;
  A2 *local_58;
  string local_50;
  
  local_60 = __return_storage_ptr__;
  Lexer::typeToString_abi_cxx11_(&local_50,(Lexer *)(ulong)this->_lextype,in_EDX);
  local_80 = &local_70;
  local_78 = 0;
  local_70 = 0;
  p_Var7 = (this->_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->_attributes)._M_t._M_impl.super__Rb_tree_header;
  local_58 = this;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,*(long *)(p_Var7 + 1),
                 (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
      std::__cxx11::string::append((char *)&local_c0);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_c0,*(ulong *)(p_Var7 + 2));
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_d0 = *plVar8;
        lStack_c8 = plVar6[3];
        local_e0 = &local_d0;
      }
      else {
        local_d0 = *plVar8;
        local_e0 = (long *)*plVar6;
      }
      local_d8 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_e0);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_90 = *puVar9;
        lStack_88 = plVar6[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *puVar9;
        local_a0 = (ulong *)*plVar6;
      }
      local_98 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0);
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  __rhs = (local_58->_tags).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (local_58->_tags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pbVar2) {
    do {
      iVar5 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar5 == 0) {
        std::operator+(&local_c0,"\x1b[1;37;44m",__rhs);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_d0 = *plVar8;
          lStack_c8 = plVar6[3];
          local_e0 = &local_d0;
        }
        else {
          local_d0 = *plVar8;
          local_e0 = (long *)*plVar6;
        }
        local_d8 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_e0);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar5 == 0) {
          std::operator+(&local_c0,"\x1b[1;37;46m",__rhs);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_d0 = *plVar8;
            lStack_c8 = plVar6[3];
            local_e0 = &local_d0;
          }
          else {
            local_d0 = *plVar8;
            local_e0 = (long *)*plVar6;
          }
          local_d8 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_e0);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar5 == 0) {
            std::operator+(&local_c0,"\x1b[1;37;42m",__rhs);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_d0 = *plVar8;
              lStack_c8 = plVar6[3];
              local_e0 = &local_d0;
            }
            else {
              local_d0 = *plVar8;
              local_e0 = (long *)*plVar6;
            }
            local_d8 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_e0);
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar5 == 0) {
              std::operator+(&local_c0,"\x1b[1;37;43m",__rhs);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
              plVar8 = plVar6 + 2;
              if ((long *)*plVar6 == plVar8) {
                local_d0 = *plVar8;
                lStack_c8 = plVar6[3];
                local_e0 = &local_d0;
              }
              else {
                local_d0 = *plVar8;
                local_e0 = (long *)*plVar6;
              }
              local_d8 = plVar6[1];
              *plVar6 = (long)plVar8;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_e0);
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)__rhs);
              if (iVar5 == 0) {
                std::operator+(&local_c0,"\x1b[1;37;45m",__rhs);
                plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
                plVar8 = plVar6 + 2;
                if ((long *)*plVar6 == plVar8) {
                  local_d0 = *plVar8;
                  lStack_c8 = plVar6[3];
                  local_e0 = &local_d0;
                }
                else {
                  local_d0 = *plVar8;
                  local_e0 = (long *)*plVar6;
                }
                local_d8 = plVar6[1];
                *plVar6 = (long)plVar8;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_e0);
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)__rhs);
                if (iVar5 == 0) {
                  std::operator+(&local_c0,"\x1b[1;37;101m",__rhs);
                  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
                  plVar8 = plVar6 + 2;
                  if ((long *)*plVar6 == plVar8) {
                    local_d0 = *plVar8;
                    lStack_c8 = plVar6[3];
                    local_e0 = &local_d0;
                  }
                  else {
                    local_d0 = *plVar8;
                    local_e0 = (long *)*plVar6;
                  }
                  local_d8 = plVar6[1];
                  *plVar6 = (long)plVar8;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_e0);
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)__rhs);
                  if (iVar5 == 0) {
                    std::operator+(&local_c0,"\x1b[38;5;7m\x1b[48;5;34m",__rhs);
                    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
                    plVar8 = plVar6 + 2;
                    if ((long *)*plVar6 == plVar8) {
                      local_d0 = *plVar8;
                      lStack_c8 = plVar6[3];
                      local_e0 = &local_d0;
                    }
                    else {
                      local_d0 = *plVar8;
                      local_e0 = (long *)*plVar6;
                    }
                    local_d8 = plVar6[1];
                    *plVar6 = (long)plVar8;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_e0);
                  }
                  else {
                    std::operator+(&local_c0,"\x1b[32m",__rhs);
                    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
                    plVar8 = plVar6 + 2;
                    if ((long *)*plVar6 == plVar8) {
                      local_d0 = *plVar8;
                      lStack_c8 = plVar6[3];
                      local_e0 = &local_d0;
                    }
                    else {
                      local_d0 = *plVar8;
                      local_e0 = (long *)*plVar6;
                    }
                    local_d8 = plVar6[1];
                    *plVar6 = (long)plVar8;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_e0);
                  }
                }
              }
            }
          }
        }
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      __rhs = __rhs + 1;
    } while (__rhs != pbVar2);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  std::__cxx11::string::append((char *)&local_c0);
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_80);
  psVar4 = local_60;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_d0 = *plVar8;
    lStack_c8 = plVar6[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *plVar8;
    local_e0 = (long *)*plVar6;
  }
  local_d8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_a0);
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    lVar3 = plVar6[3];
    (psVar4->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&psVar4->field_2 + 8) = lVar3;
  }
  else {
    (psVar4->_M_dataplus)._M_p = (pointer)*plVar6;
    (psVar4->field_2)._M_allocated_capacity = *psVar10;
  }
  psVar4->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return psVar4;
}

Assistant:

std::string A2::dump () const
{
  auto output = Lexer::typeToString (_lextype);

  // Dump attributes.
  std::string atts;
  for (auto& a : _attributes)
    atts += a.first + "='\033[33m" + a.second + "\033[0m' ";

  // Dump tags.
  std::string tags;
  for (const auto& tag : _tags)
  {
         if (tag == "BINARY")        tags += "\033[1;37;44m"             + tag + "\033[0m ";
    else if (tag == "CMD")           tags += "\033[1;37;46m"             + tag + "\033[0m ";
    else if (tag == "EXT")           tags += "\033[1;37;42m"             + tag + "\033[0m ";
    else if (tag == "HINT")          tags += "\033[1;37;43m"             + tag + "\033[0m ";
    else if (tag == "FILTER")        tags += "\033[1;37;45m"             + tag + "\033[0m ";
    else if (tag == "CONFIG")        tags += "\033[1;37;101m"            + tag + "\033[0m ";
    else if (tag == "ID")            tags += "\033[38;5;7m\033[48;5;34m" + tag + "\033[0m ";
    else                             tags += "\033[32m"                  + tag + "\033[0m ";
  }

  return output + " " + atts + tags;
}